

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.h
# Opt level: O2

QPoint __thiscall QMouseEvent::pos(QMouseEvent *this)

{
  QPoint QVar1;
  long in_FS_OFFSET;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = QSinglePointEvent::position((QSinglePointEvent *)this);
  QVar1 = QPointF::toPoint(&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline QPoint pos() const { return position().toPoint(); }